

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_writer.cc
# Opt level: O1

char * tcmalloc::DoWithWriterToStrDup
                 (ChunkedWriterConfig *config,_func_void_GenericWriter_ptr_void_ptr *body,void *arg)

{
  ChunkedWriterConfig *pCVar1;
  ChunkedWriterConfig *pCVar2;
  char *pcVar3;
  long lVar4;
  size_t __n;
  ChunkedStorage storage;
  ChunkedStorageWriter writer;
  
  storage.config = (ChunkedWriterConfig *)0x0;
  storage.last_chunk = (Chunk *)&PTR__ChunkedStorageWriter_0010cd58;
  (*body)((GenericWriter *)&storage.last_chunk,arg);
  pCVar2 = storage.config;
  storage.last_chunk = (Chunk *)&PTR__ChunkedStorageWriter_0010cd58;
  if (storage.config != (ChunkedWriterConfig *)0x0) {
    *(undefined4 *)(storage.config + 0xc) = 0;
  }
  lVar4 = 0;
  for (pCVar1 = storage.config; pCVar1 != (ChunkedWriterConfig *)0x0;
      pCVar1 = *(ChunkedWriterConfig **)pCVar1) {
    lVar4 = lVar4 + *(int *)(pCVar1 + 0xc);
  }
  pcVar3 = (char *)malloc(lVar4 + 1);
  pcVar3[lVar4] = '\0';
  while (pCVar2 != (ChunkedWriterConfig *)0x0) {
    __n = (size_t)*(int *)(pCVar2 + 0xc);
    memcpy(pcVar3 + (lVar4 - __n),pCVar2 + 0x10,__n);
    lVar4 = lVar4 - __n;
    pCVar1 = *(ChunkedWriterConfig **)pCVar2;
    (**(code **)(config + 8))(pCVar2);
    pCVar2 = pCVar1;
  }
  return pcVar3;
}

Assistant:

char* DoWithWriterToStrDup(const ChunkedWriterConfig& config, void (*body)(GenericWriter* writer, void* arg), void* arg) {
  ChunkedStorage storage(config);
  {
    ChunkedStorageWriter writer{&storage};
    body(&writer, arg);
    // Ensure writer is destroyed and releases it's entire output
    // into storage.
  }
  return storage.StrDupAndRelease();
}